

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::ArgumentParser::~ArgumentParser(ArgumentParser *this)

{
  ArgumentParser *this_local;
  
  std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  ::~map(&this->mArgumentMap);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::~list
            (&this->mOptionalArguments);
  std::__cxx11::list<argparse::Argument,_std::allocator<argparse::Argument>_>::~list
            (&this->mPositionalArguments);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {})
      : mProgramName(std::move(aProgramName)) {
    add_argument("-h", "--help")
        .help("show this help message and exit")
        .nargs(0);
  }